

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

QMetaType __thiscall QMetaObject::metaType(QMetaObject *this)

{
  uint *puVar1;
  QMetaTypeInterface *pQVar2;
  QMetaType QVar3;
  uint uVar4;
  storage_type *extraout_RDX;
  QByteArrayView *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QStack_38;
  storage_type *local_28;
  QByteArrayView local_20;
  long local_10;
  
  this_00 = &QStack_38;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (this->d).data;
  if ((int)*puVar1 < 10) {
    QVar5 = objectClassName(this);
    local_28 = QVar5.m_data;
    this_00 = &local_20;
  }
  else {
    uVar4 = puVar1[6];
    if (0xb < *puVar1) {
      uVar4 = uVar4 + puVar1[8];
    }
    pQVar2 = (this->d).metaTypes[(int)uVar4];
    if (pQVar2 != (QMetaTypeInterface *)0x0) {
      QVar3.d_ptr = (QMetaTypeInterface *)0x0;
      if ((pQVar2->typeId)._q_value.super___atomic_base<int>._M_i != 0x2b) {
        QVar3.d_ptr = pQVar2;
      }
      goto LAB_0025f2af;
    }
    QVar5 = objectClassName(this);
    local_28 = QVar5.m_data;
  }
  QByteArrayView::QByteArrayView<const_char_*,_true>(this_00,&local_28);
  QVar5.m_data = extraout_RDX;
  QVar5.m_size = (qsizetype)this_00->m_data;
  QVar3 = QMetaType::fromName((QMetaType *)this_00->m_size,QVar5);
LAB_0025f2af:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (QMetaType)QVar3.d_ptr;
}

Assistant:

QMetaType QMetaObject::metaType() const
{

    const QMetaObjectPrivate *d = priv(this->d.data);
    if (d->revision < 10) {
        // before revision 10, we did not store the metatype in the metatype array
        return QMetaType::fromName(className());
    } else {
        /* in the metatype array, we store

         | index                               | data                           |
         |----------------------------------------------------------------------|
         | 0                                   | QMetaType(property0)           |
         | ...                                 | ...                            |
         | propertyCount - 1                   | QMetaType(propertyCount - 1)   |
         | propertyCount                       | QMetaType(enumerator0)         |
         | ...                                 | ...                            |
         | propertyCount + enumeratorCount - 1 | QMetaType(enumeratorCount - 1) |
         | propertyCount + enumeratorCount     | QMetaType(class)               |

        */
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0)
        // Before revision 12 we only stored metatypes for enums if they showed
        // up as types of properties or method arguments or return values.
        // From revision 12 on, we always store them in a predictable place.
        const qsizetype offset = d->revision < 12
                ? d->propertyCount
                : d->propertyCount + d->enumeratorCount;
#else
        const qsizetype offset = d->propertyCount + d->enumeratorCount;
#endif

        auto iface = this->d.metaTypes[offset];
        if (iface && QtMetaTypePrivate::isInterfaceFor<void>(iface))
            return QMetaType(); // return invalid meta-type for namespaces
        if (iface)
            return QMetaType(iface);
        else // in case of a dynamic metaobject, we might have no metatype stored
            return QMetaType::fromName(className()); // try lookup by name in that case
    }
}